

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_fpos_t array_list_get(int bucket_idx,array_list_t *array_list)

{
  array_list_t *array_list_local;
  ion_fpos_t iStack_10;
  int bucket_idx_local;
  
  if (bucket_idx < array_list->current_size) {
    iStack_10 = array_list->data[bucket_idx];
  }
  else {
    iStack_10 = -1;
  }
  return iStack_10;
}

Assistant:

ion_fpos_t
array_list_get(
	int				bucket_idx,
	array_list_t	*array_list
) {
	/* case bucket_idx is outside of current size of array */
	if (bucket_idx >= array_list->current_size) {
		return linear_hash_end_of_list;
	}
	/* case bucket_idx is inside array */
	else {
		return array_list->data[bucket_idx];
	}
}